

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack27_24(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar2 = *(undefined1 (*) [32])(in + 1);
  auVar12 = vpmovsxbd_avx512f(_DAT_00197cc0);
  uVar3 = *in;
  auVar10 = *(undefined1 (*) [16])(in + 9);
  auVar13 = vpmovsxbd_avx512f(_DAT_00197cd0);
  uVar1 = *(ulong *)(in + 0xd);
  uVar4 = in[0x14];
  auVar8 = vpsllvd_avx2(auVar2,_DAT_00194720);
  auVar7 = vpsllvd_avx2(auVar10,_DAT_00197bc0);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar1;
  auVar11 = vpsllvd_avx2(auVar19,_DAT_00197be0);
  auVar8 = vpand_avx2(auVar8,_DAT_00194740);
  auVar7 = vpand_avx(auVar7,_DAT_00197bd0);
  *out = uVar3 & 0x7ffffff;
  uVar5 = in[0xf];
  auVar12 = vpermi2d_avx512f(auVar12,ZEXT3264(auVar2),ZEXT464(uVar3));
  auVar14 = vpmovsxbd_avx512f(_DAT_00197ce0);
  auVar12 = vpermi2d_avx512f(auVar13,auVar12,ZEXT1664(auVar10));
  auVar13 = vpmovsxbd_avx512f(_DAT_00197cf0);
  auVar15 = vpbroadcastd_avx512f(ZEXT416(0x7ffffff));
  auVar12 = vpermi2d_avx512f(auVar14,auVar12,ZEXT864(uVar1));
  auVar12 = vpsrlvd_avx512f(auVar12,_DAT_001a7b80);
  auVar10._8_8_ = 0x7ff000007fff800;
  auVar10._0_8_ = 0x7ff000007fff800;
  auVar10 = vpandq_avx512vl(auVar11,auVar10);
  auVar13 = vpermi2d_avx512f(auVar13,ZEXT3264(auVar8),ZEXT1664(auVar7));
  auVar14 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar13 = vpermi2q_avx512f(auVar14,auVar13,ZEXT1664(auVar10));
  auVar13 = vpord_avx512f(auVar12,auVar13);
  auVar12 = vpandd_avx512f(auVar12,auVar15);
  auVar14._0_20_ = auVar13._0_20_;
  auVar14._20_4_ = auVar12._20_4_;
  auVar14._24_4_ = auVar13._24_4_;
  auVar14._28_4_ = auVar13._28_4_;
  auVar14._32_4_ = auVar13._32_4_;
  auVar14._36_4_ = auVar13._36_4_;
  auVar14._40_4_ = auVar13._40_4_;
  auVar14._44_4_ = auVar12._44_4_;
  auVar14._48_4_ = auVar13._48_4_;
  auVar14._52_4_ = auVar13._52_4_;
  auVar14._56_4_ = auVar13._56_4_;
  auVar14._60_4_ = auVar13._60_4_;
  auVar10 = vpshufd_avx(auVar19,0x55);
  auVar12 = vmovdqu64_avx512f(auVar14);
  *(undefined1 (*) [64])(out + 1) = auVar12;
  uVar1 = *(ulong *)(in + 0x10);
  auVar10 = vpinsrd_avx(auVar10,uVar5,1);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  auVar7 = vpsllvd_avx2(auVar17,_DAT_001a4f70);
  auVar11._8_8_ = 0x7fffff004000000;
  auVar11._0_8_ = 0x7fffff004000000;
  auVar11 = vpandq_avx512vl(auVar7,auVar11);
  auVar7 = vpinsrd_avx(auVar15._0_16_,(uVar5 & 0x3f) << 0x15,0);
  uVar6 = *(ulong *)(in + 0x12);
  auVar10 = vshufps_avx(auVar10,auVar17,4);
  auVar9 = vpsrlvd_avx2(auVar10,_DAT_001a4f90);
  auVar10 = vpunpckldq_avx(auVar7,auVar11);
  auVar11 = vpor_avx(auVar9,auVar10);
  auVar10 = vpand_avx(auVar9,auVar15._0_16_);
  auVar7 = vpmovsxbd_avx(ZEXT416(0x401));
  auVar10 = vpblendd_avx2(auVar11,auVar10,4);
  *(undefined1 (*) [16])(out + 0x11) = auVar10;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar6;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1;
  auVar10 = vpermi2d_avx512vl(auVar7,auVar18,auVar16);
  auVar7 = vpsrlvd_avx2(auVar10,_DAT_001a4fa0);
  auVar10 = vpsllvd_avx2(auVar16,_DAT_001a4fb0);
  auVar9._8_8_ = 0x7ffc00007fffe00;
  auVar9._0_8_ = 0x7ffc00007fffe00;
  auVar10 = vpternlogq_avx512vl(auVar10,auVar7,auVar9,0xec);
  *(long *)(out + 0x15) = auVar10._0_8_;
  out[0x17] = (uVar4 & 0xff) << 0x13 | (uint)(uVar6 >> 0x2d);
  return in + 0x15;
}

Assistant:

const uint32_t *__fastunpack27_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 22)) << (27 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 17)) << (27 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 12)) << (27 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 7)) << (27 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 2)) << (27 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 27);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 24)) << (27 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 19)) << (27 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 14)) << (27 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 9)) << (27 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 4)) << (27 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 27);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 26)) << (27 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 21)) << (27 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 16)) << (27 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 11)) << (27 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 6)) << (27 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 1)) << (27 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 27);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 23)) << (27 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 18)) << (27 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 13)) << (27 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 8)) << (27 - 8);
  out++;

  return in + 1;
}